

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

int xmlXPathCompOpEval(xmlXPathParserContextPtr ctxt,xmlXPathStepOpPtr op)

{
  xmlXPathStepOpPtr pxVar1;
  int iVar2;
  xmlNodeSetPtr pxVar3;
  xmlXPathObjectPtr pxVar4;
  xmlNodePtr local_b0;
  xmlNodePtr last;
  xmlNodePtr pxStack_a0;
  int f;
  xmlNodePtr first;
  xmlXPathObjectPtr val_1;
  xmlNodeSetPtr set;
  xmlXPathObjectPtr obj;
  xmlChar *URI_1;
  int frame;
  int i;
  xmlChar *oldFuncURI;
  xmlChar *oldFunc;
  xmlXPathFunction func;
  xmlChar *URI;
  xmlXPathObjectPtr val;
  xmlXPathObjectPtr arg2;
  xmlXPathObjectPtr arg1;
  xmlXPathCompExprPtr comp;
  int local_28;
  int ret;
  int equal;
  int total;
  xmlXPathStepOpPtr op_local;
  xmlXPathParserContextPtr ctxt_local;
  
  ret = 0;
  if (ctxt->error != 0) {
    return 0;
  }
  _equal = op;
  op_local = (xmlXPathStepOpPtr)ctxt;
  if ((ctxt->context->opLimit != 0) && (iVar2 = xmlXPathCheckOpLimit(ctxt,1), iVar2 < 0)) {
    return 0;
  }
  pxVar1 = op_local;
  if (4999 < *(int *)((long)op_local->value4 + 0x170)) {
    xmlXPathErr((xmlXPathParserContextPtr)op_local,0x1a);
    return 0;
  }
  *(int *)((long)op_local->value4 + 0x170) = *(int *)((long)op_local->value4 + 0x170) + 1;
  arg1 = *(xmlXPathObjectPtr *)(op_local + 1);
  switch(_equal->op) {
  case XPATH_OP_END:
    break;
  case XPATH_OP_AND:
    iVar2 = xmlXPathCompOpEval((xmlXPathParserContextPtr)op_local,
                               (xmlXPathStepOpPtr)
                               ((long)arg1->nodesetval + (long)_equal->ch1 * 0x38));
    ret = iVar2 + ret;
    if (op_local->value2 != 0) {
      return 0;
    }
    xmlXPathBooleanFunction((xmlXPathParserContextPtr)op_local,1);
    if ((op_local->value5 != (void *)0x0) && (*(int *)((long)op_local->value5 + 0x10) != 0)) {
      val = xmlXPathValuePop((xmlXPathParserContextPtr)op_local);
      iVar2 = xmlXPathCompOpEval((xmlXPathParserContextPtr)op_local,
                                 (xmlXPathStepOpPtr)
                                 ((long)arg1->nodesetval + (long)_equal->ch2 * 0x38));
      ret = iVar2 + ret;
      if (op_local->value2 == 0) {
        xmlXPathBooleanFunction((xmlXPathParserContextPtr)op_local,1);
        if (op_local->value5 != (void *)0x0) {
          *(uint *)((long)op_local->value5 + 0x10) =
               val->boolval & *(uint *)((long)op_local->value5 + 0x10);
        }
        xmlXPathReleaseObject((xmlXPathContextPtr)op_local->value4,val);
      }
      else {
        xmlXPathFreeObject(val);
      }
    }
    break;
  case XPATH_OP_OR:
    iVar2 = xmlXPathCompOpEval((xmlXPathParserContextPtr)op_local,
                               (xmlXPathStepOpPtr)
                               ((long)arg1->nodesetval + (long)_equal->ch1 * 0x38));
    ret = iVar2 + ret;
    if (op_local->value2 != 0) {
      return 0;
    }
    xmlXPathBooleanFunction((xmlXPathParserContextPtr)op_local,1);
    if ((op_local->value5 != (void *)0x0) && (*(int *)((long)op_local->value5 + 0x10) != 1)) {
      val = xmlXPathValuePop((xmlXPathParserContextPtr)op_local);
      iVar2 = xmlXPathCompOpEval((xmlXPathParserContextPtr)op_local,
                                 (xmlXPathStepOpPtr)
                                 ((long)arg1->nodesetval + (long)_equal->ch2 * 0x38));
      ret = iVar2 + ret;
      if (op_local->value2 == 0) {
        xmlXPathBooleanFunction((xmlXPathParserContextPtr)op_local,1);
        if (op_local->value5 != (void *)0x0) {
          *(uint *)((long)op_local->value5 + 0x10) =
               val->boolval | *(uint *)((long)op_local->value5 + 0x10);
        }
        xmlXPathReleaseObject((xmlXPathContextPtr)op_local->value4,val);
      }
      else {
        xmlXPathFreeObject(val);
      }
    }
    break;
  case XPATH_OP_EQUAL:
    iVar2 = xmlXPathCompOpEval((xmlXPathParserContextPtr)op_local,
                               (xmlXPathStepOpPtr)
                               ((long)arg1->nodesetval + (long)_equal->ch1 * 0x38));
    ret = iVar2 + ret;
    if (op_local->value2 != 0) {
      return 0;
    }
    iVar2 = xmlXPathCompOpEval((xmlXPathParserContextPtr)op_local,
                               (xmlXPathStepOpPtr)
                               ((long)arg1->nodesetval + (long)_equal->ch2 * 0x38));
    ret = iVar2 + ret;
    if (op_local->value2 != 0) {
      return 0;
    }
    if (_equal->value == 0) {
      local_28 = xmlXPathNotEqualValues((xmlXPathParserContextPtr)op_local);
    }
    else {
      local_28 = xmlXPathEqualValues((xmlXPathParserContextPtr)op_local);
    }
    pxVar1 = op_local;
    pxVar4 = xmlXPathCacheNewBoolean((xmlXPathParserContextPtr)op_local,local_28);
    xmlXPathValuePush((xmlXPathParserContextPtr)pxVar1,pxVar4);
    break;
  case XPATH_OP_CMP:
    iVar2 = xmlXPathCompOpEval((xmlXPathParserContextPtr)op_local,
                               (xmlXPathStepOpPtr)
                               ((long)arg1->nodesetval + (long)_equal->ch1 * 0x38));
    ret = iVar2 + ret;
    if (op_local->value2 != 0) {
      return 0;
    }
    iVar2 = xmlXPathCompOpEval((xmlXPathParserContextPtr)op_local,
                               (xmlXPathStepOpPtr)
                               ((long)arg1->nodesetval + (long)_equal->ch2 * 0x38));
    ret = iVar2 + ret;
    if (op_local->value2 != 0) {
      return 0;
    }
    comp._4_4_ = xmlXPathCompareValues
                           ((xmlXPathParserContextPtr)op_local,_equal->value,_equal->value2);
    pxVar1 = op_local;
    pxVar4 = xmlXPathCacheNewBoolean((xmlXPathParserContextPtr)op_local,comp._4_4_);
    xmlXPathValuePush((xmlXPathParserContextPtr)pxVar1,pxVar4);
    break;
  case XPATH_OP_PLUS:
    iVar2 = xmlXPathCompOpEval((xmlXPathParserContextPtr)op_local,
                               (xmlXPathStepOpPtr)
                               ((long)arg1->nodesetval + (long)_equal->ch1 * 0x38));
    ret = iVar2 + ret;
    if (op_local->value2 != 0) {
      return 0;
    }
    if (_equal->ch2 != -1) {
      iVar2 = xmlXPathCompOpEval((xmlXPathParserContextPtr)op_local,
                                 (xmlXPathStepOpPtr)
                                 ((long)arg1->nodesetval + (long)_equal->ch2 * 0x38));
      ret = iVar2 + ret;
    }
    if (op_local->value2 != 0) {
      return 0;
    }
    if (_equal->value == 0) {
      xmlXPathSubValues((xmlXPathParserContextPtr)op_local);
    }
    else if (_equal->value == 1) {
      xmlXPathAddValues((xmlXPathParserContextPtr)op_local);
    }
    else if (_equal->value == 2) {
      xmlXPathValueFlipSign((xmlXPathParserContextPtr)op_local);
    }
    else if (_equal->value == 3) {
      if ((op_local->value5 != (void *)0x0) && (*op_local->value5 != 3)) {
        xmlXPathNumberFunction((xmlXPathParserContextPtr)op_local,1);
      }
      if ((op_local->value5 == (void *)0x0) || (*op_local->value5 != 3)) {
        xmlXPathErr((xmlXPathParserContextPtr)op_local,0xb);
        return 0;
      }
    }
    break;
  case XPATH_OP_MULT:
    iVar2 = xmlXPathCompOpEval((xmlXPathParserContextPtr)op_local,
                               (xmlXPathStepOpPtr)
                               ((long)arg1->nodesetval + (long)_equal->ch1 * 0x38));
    ret = iVar2 + ret;
    if (op_local->value2 != 0) {
      return 0;
    }
    iVar2 = xmlXPathCompOpEval((xmlXPathParserContextPtr)op_local,
                               (xmlXPathStepOpPtr)
                               ((long)arg1->nodesetval + (long)_equal->ch2 * 0x38));
    ret = iVar2 + ret;
    if (op_local->value2 != 0) {
      return 0;
    }
    if (_equal->value == 0) {
      xmlXPathMultValues((xmlXPathParserContextPtr)op_local);
    }
    else if (_equal->value == 1) {
      xmlXPathDivValues((xmlXPathParserContextPtr)op_local);
    }
    else if (_equal->value == 2) {
      xmlXPathModValues((xmlXPathParserContextPtr)op_local);
    }
    break;
  case XPATH_OP_UNION:
    iVar2 = xmlXPathCompOpEval((xmlXPathParserContextPtr)op_local,
                               (xmlXPathStepOpPtr)
                               ((long)arg1->nodesetval + (long)_equal->ch1 * 0x38));
    ret = iVar2 + ret;
    if (op_local->value2 != 0) {
      return 0;
    }
    iVar2 = xmlXPathCompOpEval((xmlXPathParserContextPtr)op_local,
                               (xmlXPathStepOpPtr)
                               ((long)arg1->nodesetval + (long)_equal->ch2 * 0x38));
    ret = iVar2 + ret;
    if (op_local->value2 != 0) {
      return 0;
    }
    val = xmlXPathValuePop((xmlXPathParserContextPtr)op_local);
    arg2 = xmlXPathValuePop((xmlXPathParserContextPtr)op_local);
    if ((((arg2 == (xmlXPathObjectPtr)0x0) || (arg2->type != XPATH_NODESET)) ||
        (val == (xmlXPathObjectPtr)0x0)) || (val->type != XPATH_NODESET)) {
      xmlXPathReleaseObject((xmlXPathContextPtr)op_local->value4,arg2);
      xmlXPathReleaseObject((xmlXPathContextPtr)op_local->value4,val);
      xmlXPathErr((xmlXPathParserContextPtr)op_local,0xb);
      return 0;
    }
    if ((*(long *)((long)op_local->value4 + 0x160) == 0) ||
       (((arg2->nodesetval == (xmlNodeSetPtr)0x0 ||
         (iVar2 = xmlXPathCheckOpLimit
                            ((xmlXPathParserContextPtr)op_local,(long)arg2->nodesetval->nodeNr),
         -1 < iVar2)) &&
        ((val->nodesetval == (xmlNodeSetPtr)0x0 ||
         (iVar2 = xmlXPathCheckOpLimit
                            ((xmlXPathParserContextPtr)op_local,(long)val->nodesetval->nodeNr),
         -1 < iVar2)))))) {
      if ((val->nodesetval != (xmlNodeSetPtr)0x0) && (val->nodesetval->nodeNr != 0)) {
        pxVar3 = xmlXPathNodeSetMerge(arg2->nodesetval,val->nodesetval);
        arg2->nodesetval = pxVar3;
        if (arg2->nodesetval == (xmlNodeSetPtr)0x0) {
          xmlXPathPErrMemory((xmlXPathParserContextPtr)op_local);
        }
      }
      xmlXPathValuePush((xmlXPathParserContextPtr)op_local,arg2);
      xmlXPathReleaseObject((xmlXPathContextPtr)op_local->value4,val);
    }
    else {
      xmlXPathReleaseObject((xmlXPathContextPtr)op_local->value4,arg2);
      xmlXPathReleaseObject((xmlXPathContextPtr)op_local->value4,val);
    }
    break;
  case XPATH_OP_ROOT:
    xmlXPathRoot((xmlXPathParserContextPtr)op_local);
    break;
  case XPATH_OP_NODE:
    if (_equal->ch1 != -1) {
      iVar2 = xmlXPathCompOpEval((xmlXPathParserContextPtr)op_local,
                                 (xmlXPathStepOpPtr)
                                 ((long)arg1->nodesetval + (long)_equal->ch1 * 0x38));
      ret = iVar2 + ret;
    }
    if (op_local->value2 != 0) {
      return 0;
    }
    if (_equal->ch2 != -1) {
      iVar2 = xmlXPathCompOpEval((xmlXPathParserContextPtr)op_local,
                                 (xmlXPathStepOpPtr)
                                 ((long)arg1->nodesetval + (long)_equal->ch2 * 0x38));
      ret = iVar2 + ret;
    }
    pxVar1 = op_local;
    if (op_local->value2 != 0) {
      return 0;
    }
    pxVar4 = xmlXPathCacheNewNodeSet
                       ((xmlXPathParserContextPtr)op_local,
                        *(xmlNodePtr *)((long)op_local->value4 + 8));
    xmlXPathValuePush((xmlXPathParserContextPtr)pxVar1,pxVar4);
    break;
  case XPATH_OP_COLLECT:
    if (_equal->ch1 != -1) {
      iVar2 = xmlXPathCompOpEval((xmlXPathParserContextPtr)op_local,
                                 (xmlXPathStepOpPtr)
                                 ((long)arg1->nodesetval + (long)_equal->ch1 * 0x38));
      ret = iVar2 + ret;
      if (op_local->value2 != 0) {
        return 0;
      }
      iVar2 = xmlXPathNodeCollectAndTest
                        ((xmlXPathParserContextPtr)op_local,_equal,(xmlNodePtr *)0x0,
                         (xmlNodePtr *)0x0,0);
      ret = iVar2 + ret;
    }
    break;
  case XPATH_OP_VALUE:
    pxVar4 = xmlXPathCacheObjectCopy
                       ((xmlXPathParserContextPtr)op_local,(xmlXPathObjectPtr)_equal->value4);
    xmlXPathValuePush((xmlXPathParserContextPtr)pxVar1,pxVar4);
    break;
  case XPATH_OP_VARIABLE:
    if (_equal->ch1 != -1) {
      iVar2 = xmlXPathCompOpEval((xmlXPathParserContextPtr)op_local,
                                 (xmlXPathStepOpPtr)
                                 ((long)arg1->nodesetval + (long)_equal->ch1 * 0x38));
      ret = iVar2 + ret;
    }
    if (_equal->value5 == (void *)0x0) {
      URI = (xmlChar *)
            xmlXPathVariableLookup((xmlXPathContextPtr)op_local->value4,(xmlChar *)_equal->value4);
      if ((xmlXPathObjectPtr)URI == (xmlXPathObjectPtr)0x0) {
        xmlXPathErr((xmlXPathParserContextPtr)op_local,5);
        return 0;
      }
      xmlXPathValuePush((xmlXPathParserContextPtr)op_local,(xmlXPathObjectPtr)URI);
    }
    else {
      func = (xmlXPathFunction)
             xmlXPathNsLookup((xmlXPathContextPtr)op_local->value4,(xmlChar *)_equal->value5);
      if (func == (xmlXPathFunction)0x0) {
        xmlXPathErr((xmlXPathParserContextPtr)op_local,0x13);
        return 0;
      }
      URI = (xmlChar *)
            xmlXPathVariableLookupNS
                      ((xmlXPathContextPtr)op_local->value4,(xmlChar *)_equal->value4,
                       (xmlChar *)func);
      if ((xmlXPathObjectPtr)URI == (xmlXPathObjectPtr)0x0) {
        xmlXPathErr((xmlXPathParserContextPtr)op_local,5);
        return 0;
      }
      xmlXPathValuePush((xmlXPathParserContextPtr)op_local,(xmlXPathObjectPtr)URI);
    }
    break;
  case XPATH_OP_FUNCTION:
    URI_1._0_4_ = *(int *)&op_local->cache;
    if (_equal->ch1 != -1) {
      iVar2 = xmlXPathCompOpEval((xmlXPathParserContextPtr)op_local,
                                 (xmlXPathStepOpPtr)
                                 ((long)arg1->nodesetval + (long)_equal->ch1 * 0x38));
      ret = iVar2 + ret;
      if (op_local->value2 != 0) break;
    }
    if (*(int *)&op_local->cache < (int)URI_1 + _equal->value) {
      xmlXPathErr((xmlXPathParserContextPtr)op_local,10);
      return 0;
    }
    for (URI_1._4_4_ = 0; URI_1._4_4_ < _equal->value; URI_1._4_4_ = URI_1._4_4_ + 1) {
      if (*(long *)((long)op_local->cacheURI +
                   (long)((*(int *)&op_local->cache + -1) - URI_1._4_4_) * 8) == 0) {
        xmlXPathErr((xmlXPathParserContextPtr)op_local,10);
        return 0;
      }
    }
    if (_equal->cache == (xmlXPathFunction)0x0) {
      obj = (xmlXPathObjectPtr)0x0;
      if (_equal->value5 == (void *)0x0) {
        oldFunc = (xmlChar *)
                  xmlXPathFunctionLookup
                            ((xmlXPathContextPtr)op_local->value4,(xmlChar *)_equal->value4);
      }
      else {
        obj = (xmlXPathObjectPtr)
              xmlXPathNsLookup((xmlXPathContextPtr)op_local->value4,(xmlChar *)_equal->value5);
        if (obj == (xmlXPathObjectPtr)0x0) {
          xmlXPathErr((xmlXPathParserContextPtr)op_local,0x13);
          return 0;
        }
        oldFunc = (xmlChar *)
                  xmlXPathFunctionLookupNS
                            ((xmlXPathContextPtr)op_local->value4,(xmlChar *)_equal->value4,
                             (xmlChar *)obj);
      }
      if (oldFunc == (xmlChar *)0x0) {
        xmlXPathErr((xmlXPathParserContextPtr)op_local,9);
        return 0;
      }
      _equal->cache = (xmlXPathFunction)oldFunc;
      _equal->cacheURI = obj;
    }
    else {
      oldFunc = (xmlChar *)_equal->cache;
    }
    oldFuncURI = *(xmlChar **)((long)op_local->value4 + 0xa8);
    _frame = *(undefined8 *)((long)op_local->value4 + 0xb0);
    *(void **)((long)op_local->value4 + 0xa8) = _equal->value4;
    *(void **)((long)op_local->value4 + 0xb0) = _equal->cacheURI;
    (*(code *)oldFunc)(op_local,_equal->value);
    *(xmlChar **)((long)op_local->value4 + 0xa8) = oldFuncURI;
    *(undefined8 *)((long)op_local->value4 + 0xb0) = _frame;
    if ((op_local->value2 == 0) && (*(int *)&op_local->cache != (int)URI_1 + 1)) {
      xmlXPathErr((xmlXPathParserContextPtr)op_local,0x17);
      return 0;
    }
    break;
  case XPATH_OP_ARG:
    if (_equal->ch1 != -1) {
      iVar2 = xmlXPathCompOpEval((xmlXPathParserContextPtr)op_local,
                                 (xmlXPathStepOpPtr)
                                 ((long)arg1->nodesetval + (long)_equal->ch1 * 0x38));
      ret = iVar2 + ret;
      if (op_local->value2 != 0) {
        return 0;
      }
    }
    if (_equal->ch2 != -1) {
      iVar2 = xmlXPathCompOpEval((xmlXPathParserContextPtr)op_local,
                                 (xmlXPathStepOpPtr)
                                 ((long)arg1->nodesetval + (long)_equal->ch2 * 0x38));
      ret = iVar2 + ret;
      if (op_local->value2 != 0) {
        return 0;
      }
    }
    break;
  case XPATH_OP_PREDICATE:
  case XPATH_OP_FILTER:
    if (((((_equal->ch1 == -1) || (_equal->ch2 == -1)) ||
         ((*(int *)((long)arg1->nodesetval + (long)_equal->ch1 * 0x38) != 0x11 &&
          (*(int *)((long)arg1->nodesetval + (long)_equal->ch1 * 0x38) != 0x10)))) ||
        ((*(int *)((long)arg1->nodesetval + (long)_equal->ch2 * 0x38) != 0xb ||
         (first = *(xmlNodePtr *)((long)arg1->nodesetval + (long)_equal->ch2 * 0x38 + 0x18),
         first == (xmlNodePtr)0x0)))) ||
       ((*(int *)&first->_private != 3 ||
        (((double)first->children != 1.0 || (NAN((double)first->children))))))) {
      if (((((_equal->ch1 == -1) ||
            (((_equal->ch2 == -1 ||
              (*(int *)((long)arg1->nodesetval + (long)_equal->ch1 * 0x38) != 0x11)) ||
             (*(int *)((long)arg1->nodesetval + (long)_equal->ch2 * 0x38) != 0x11)))) ||
           (((last._4_4_ = *(int *)((long)arg1->nodesetval + (long)_equal->ch2 * 0x38 + 4),
             last._4_4_ == -1 || (*(int *)((long)arg1->nodesetval + (long)last._4_4_ * 0x38) != 0xd)
             ) || (*(long *)((long)arg1->nodesetval + (long)last._4_4_ * 0x38 + 0x20) != 0)))) ||
          ((*(int *)((long)arg1->nodesetval + (long)last._4_4_ * 0x38 + 0xc) != 0 ||
           (*(long *)((long)arg1->nodesetval + (long)last._4_4_ * 0x38 + 0x18) == 0)))) ||
         (iVar2 = xmlStrEqual(*(xmlChar **)((long)arg1->nodesetval + (long)last._4_4_ * 0x38 + 0x18)
                              ,(xmlChar *)"last"), iVar2 == 0)) {
        if (_equal->ch1 != -1) {
          iVar2 = xmlXPathCompOpEval((xmlXPathParserContextPtr)op_local,
                                     (xmlXPathStepOpPtr)
                                     ((long)arg1->nodesetval + (long)_equal->ch1 * 0x38));
          ret = iVar2 + ret;
        }
        if (op_local->value2 != 0) {
          return 0;
        }
        if ((_equal->ch2 != -1) && (op_local->value5 != (void *)0x0)) {
          if ((op_local->value5 == (void *)0x0) || (*op_local->value5 != 1)) {
            xmlXPathErr((xmlXPathParserContextPtr)op_local,0xb);
            return 0;
          }
          set = (xmlNodeSetPtr)xmlXPathValuePop((xmlXPathParserContextPtr)op_local);
          val_1 = (xmlXPathObjectPtr)((xmlXPathObjectPtr)set)->nodesetval;
          if (val_1 != (xmlXPathObjectPtr)0x0) {
            xmlXPathNodeSetFilter
                      ((xmlXPathParserContextPtr)op_local,(xmlNodeSetPtr)val_1,_equal->ch2,1,
                       val_1->type,1);
          }
          xmlXPathValuePush((xmlXPathParserContextPtr)op_local,(xmlXPathObjectPtr)set);
        }
      }
      else {
        local_b0 = (xmlNodePtr)0x0;
        iVar2 = xmlXPathCompOpEvalLast
                          ((xmlXPathParserContextPtr)op_local,
                           (xmlXPathStepOpPtr)((long)arg1->nodesetval + (long)_equal->ch1 * 0x38),
                           &local_b0);
        ret = iVar2 + ret;
        if (op_local->value2 != 0) {
          return 0;
        }
        if ((((op_local->value5 != (void *)0x0) && (*op_local->value5 == 1)) &&
            (*(long *)((long)op_local->value5 + 8) != 0)) &&
           ((*(long *)(*(long *)((long)op_local->value5 + 8) + 8) != 0 &&
            (1 < **(int **)((long)op_local->value5 + 8))))) {
          xmlXPathNodeSetKeepLast(*(xmlNodeSetPtr *)((long)op_local->value5 + 8));
        }
      }
    }
    else {
      pxStack_a0 = (xmlNodePtr)0x0;
      iVar2 = xmlXPathCompOpEvalFirst
                        ((xmlXPathParserContextPtr)op_local,
                         (xmlXPathStepOpPtr)((long)arg1->nodesetval + (long)_equal->ch1 * 0x38),
                         &stack0xffffffffffffff60);
      ret = iVar2 + ret;
      if (op_local->value2 != 0) {
        return 0;
      }
      if (((op_local->value5 != (void *)0x0) && (*op_local->value5 == 1)) &&
         ((*(long *)((long)op_local->value5 + 8) != 0 &&
          (1 < **(int **)((long)op_local->value5 + 8))))) {
        xmlXPathNodeSetClearFromPos(*(xmlNodeSetPtr *)((long)op_local->value5 + 8),1,1);
      }
    }
    break;
  case XPATH_OP_SORT:
    if (_equal->ch1 != -1) {
      iVar2 = xmlXPathCompOpEval((xmlXPathParserContextPtr)op_local,
                                 (xmlXPathStepOpPtr)
                                 ((long)arg1->nodesetval + (long)_equal->ch1 * 0x38));
      ret = iVar2 + ret;
    }
    if (op_local->value2 != 0) {
      return 0;
    }
    if ((((op_local->value5 != (void *)0x0) && (*op_local->value5 == 1)) &&
        (*(long *)((long)op_local->value5 + 8) != 0)) &&
       (1 < **(int **)((long)op_local->value5 + 8))) {
      xmlXPathNodeSetSort(*(xmlNodeSetPtr *)((long)op_local->value5 + 8));
    }
    break;
  default:
    xmlXPathErr((xmlXPathParserContextPtr)op_local,10);
    return 0;
  }
  *(int *)((long)op_local->value4 + 0x170) = *(int *)((long)op_local->value4 + 0x170) + -1;
  return ret;
}

Assistant:

static int
xmlXPathCompOpEval(xmlXPathParserContextPtr ctxt, xmlXPathStepOpPtr op)
{
    int total = 0;
    int equal, ret;
    xmlXPathCompExprPtr comp;
    xmlXPathObjectPtr arg1, arg2;

    CHECK_ERROR0;
    if (OP_LIMIT_EXCEEDED(ctxt, 1))
        return(0);
    if (ctxt->context->depth >= XPATH_MAX_RECURSION_DEPTH)
        XP_ERROR0(XPATH_RECURSION_LIMIT_EXCEEDED);
    ctxt->context->depth += 1;
    comp = ctxt->comp;
    switch (op->op) {
        case XPATH_OP_END:
            break;
        case XPATH_OP_AND:
            total += xmlXPathCompOpEval(ctxt, &comp->steps[op->ch1]);
	    CHECK_ERROR0;
            xmlXPathBooleanFunction(ctxt, 1);
            if ((ctxt->value == NULL) || (ctxt->value->boolval == 0))
                break;
            arg2 = xmlXPathValuePop(ctxt);
            total += xmlXPathCompOpEval(ctxt, &comp->steps[op->ch2]);
	    if (ctxt->error) {
		xmlXPathFreeObject(arg2);
		break;
	    }
            xmlXPathBooleanFunction(ctxt, 1);
            if (ctxt->value != NULL)
                ctxt->value->boolval &= arg2->boolval;
	    xmlXPathReleaseObject(ctxt->context, arg2);
            break;
        case XPATH_OP_OR:
            total += xmlXPathCompOpEval(ctxt, &comp->steps[op->ch1]);
	    CHECK_ERROR0;
            xmlXPathBooleanFunction(ctxt, 1);
            if ((ctxt->value == NULL) || (ctxt->value->boolval == 1))
                break;
            arg2 = xmlXPathValuePop(ctxt);
            total += xmlXPathCompOpEval(ctxt, &comp->steps[op->ch2]);
	    if (ctxt->error) {
		xmlXPathFreeObject(arg2);
		break;
	    }
            xmlXPathBooleanFunction(ctxt, 1);
            if (ctxt->value != NULL)
                ctxt->value->boolval |= arg2->boolval;
	    xmlXPathReleaseObject(ctxt->context, arg2);
            break;
        case XPATH_OP_EQUAL:
            total += xmlXPathCompOpEval(ctxt, &comp->steps[op->ch1]);
	    CHECK_ERROR0;
            total += xmlXPathCompOpEval(ctxt, &comp->steps[op->ch2]);
	    CHECK_ERROR0;
	    if (op->value)
		equal = xmlXPathEqualValues(ctxt);
	    else
		equal = xmlXPathNotEqualValues(ctxt);
	    xmlXPathValuePush(ctxt, xmlXPathCacheNewBoolean(ctxt, equal));
            break;
        case XPATH_OP_CMP:
            total += xmlXPathCompOpEval(ctxt, &comp->steps[op->ch1]);
	    CHECK_ERROR0;
            total += xmlXPathCompOpEval(ctxt, &comp->steps[op->ch2]);
	    CHECK_ERROR0;
            ret = xmlXPathCompareValues(ctxt, op->value, op->value2);
	    xmlXPathValuePush(ctxt, xmlXPathCacheNewBoolean(ctxt, ret));
            break;
        case XPATH_OP_PLUS:
            total += xmlXPathCompOpEval(ctxt, &comp->steps[op->ch1]);
	    CHECK_ERROR0;
            if (op->ch2 != -1) {
                total += xmlXPathCompOpEval(ctxt, &comp->steps[op->ch2]);
	    }
	    CHECK_ERROR0;
            if (op->value == 0)
                xmlXPathSubValues(ctxt);
            else if (op->value == 1)
                xmlXPathAddValues(ctxt);
            else if (op->value == 2)
                xmlXPathValueFlipSign(ctxt);
            else if (op->value == 3) {
                CAST_TO_NUMBER;
                CHECK_TYPE0(XPATH_NUMBER);
            }
            break;
        case XPATH_OP_MULT:
            total += xmlXPathCompOpEval(ctxt, &comp->steps[op->ch1]);
	    CHECK_ERROR0;
            total += xmlXPathCompOpEval(ctxt, &comp->steps[op->ch2]);
	    CHECK_ERROR0;
            if (op->value == 0)
                xmlXPathMultValues(ctxt);
            else if (op->value == 1)
                xmlXPathDivValues(ctxt);
            else if (op->value == 2)
                xmlXPathModValues(ctxt);
            break;
        case XPATH_OP_UNION:
            total += xmlXPathCompOpEval(ctxt, &comp->steps[op->ch1]);
	    CHECK_ERROR0;
            total += xmlXPathCompOpEval(ctxt, &comp->steps[op->ch2]);
	    CHECK_ERROR0;

            arg2 = xmlXPathValuePop(ctxt);
            arg1 = xmlXPathValuePop(ctxt);
            if ((arg1 == NULL) || (arg1->type != XPATH_NODESET) ||
                (arg2 == NULL) || (arg2->type != XPATH_NODESET)) {
	        xmlXPathReleaseObject(ctxt->context, arg1);
	        xmlXPathReleaseObject(ctxt->context, arg2);
                XP_ERROR0(XPATH_INVALID_TYPE);
            }
            if ((ctxt->context->opLimit != 0) &&
                (((arg1->nodesetval != NULL) &&
                  (xmlXPathCheckOpLimit(ctxt,
                                        arg1->nodesetval->nodeNr) < 0)) ||
                 ((arg2->nodesetval != NULL) &&
                  (xmlXPathCheckOpLimit(ctxt,
                                        arg2->nodesetval->nodeNr) < 0)))) {
	        xmlXPathReleaseObject(ctxt->context, arg1);
	        xmlXPathReleaseObject(ctxt->context, arg2);
                break;
            }

	    if (((arg2->nodesetval != NULL) &&
		 (arg2->nodesetval->nodeNr != 0)))
	    {
		arg1->nodesetval = xmlXPathNodeSetMerge(arg1->nodesetval,
							arg2->nodesetval);
                if (arg1->nodesetval == NULL)
                    xmlXPathPErrMemory(ctxt);
	    }

            xmlXPathValuePush(ctxt, arg1);
	    xmlXPathReleaseObject(ctxt->context, arg2);
            break;
        case XPATH_OP_ROOT:
            xmlXPathRoot(ctxt);
            break;
        case XPATH_OP_NODE:
            if (op->ch1 != -1)
                total += xmlXPathCompOpEval(ctxt, &comp->steps[op->ch1]);
	    CHECK_ERROR0;
            if (op->ch2 != -1)
                total += xmlXPathCompOpEval(ctxt, &comp->steps[op->ch2]);
	    CHECK_ERROR0;
	    xmlXPathValuePush(ctxt, xmlXPathCacheNewNodeSet(ctxt,
                                                    ctxt->context->node));
            break;
        case XPATH_OP_COLLECT:{
                if (op->ch1 == -1)
                    break;

                total += xmlXPathCompOpEval(ctxt, &comp->steps[op->ch1]);
		CHECK_ERROR0;

                total += xmlXPathNodeCollectAndTest(ctxt, op, NULL, NULL, 0);
                break;
            }
        case XPATH_OP_VALUE:
            xmlXPathValuePush(ctxt, xmlXPathCacheObjectCopy(ctxt, op->value4));
            break;
        case XPATH_OP_VARIABLE:{
		xmlXPathObjectPtr val;

                if (op->ch1 != -1)
                    total +=
                        xmlXPathCompOpEval(ctxt, &comp->steps[op->ch1]);
                if (op->value5 == NULL) {
		    val = xmlXPathVariableLookup(ctxt->context, op->value4);
		    if (val == NULL)
			XP_ERROR0(XPATH_UNDEF_VARIABLE_ERROR);
                    xmlXPathValuePush(ctxt, val);
		} else {
                    const xmlChar *URI;

                    URI = xmlXPathNsLookup(ctxt->context, op->value5);
                    if (URI == NULL) {
                        XP_ERROR0(XPATH_UNDEF_PREFIX_ERROR);
                        break;
                    }
		    val = xmlXPathVariableLookupNS(ctxt->context,
                                                       op->value4, URI);
		    if (val == NULL)
			XP_ERROR0(XPATH_UNDEF_VARIABLE_ERROR);
                    xmlXPathValuePush(ctxt, val);
                }
                break;
            }
        case XPATH_OP_FUNCTION:{
                xmlXPathFunction func;
                const xmlChar *oldFunc, *oldFuncURI;
		int i;
                int frame;

                frame = ctxt->valueNr;
                if (op->ch1 != -1) {
                    total +=
                        xmlXPathCompOpEval(ctxt, &comp->steps[op->ch1]);
                    if (ctxt->error != XPATH_EXPRESSION_OK)
                        break;
                }
		if (ctxt->valueNr < frame + op->value)
		    XP_ERROR0(XPATH_INVALID_OPERAND);
		for (i = 0; i < op->value; i++) {
		    if (ctxt->valueTab[(ctxt->valueNr - 1) - i] == NULL)
			XP_ERROR0(XPATH_INVALID_OPERAND);
                }
                if (op->cache != NULL)
                    func = op->cache;
                else {
                    const xmlChar *URI = NULL;

                    if (op->value5 == NULL)
                        func =
                            xmlXPathFunctionLookup(ctxt->context,
                                                   op->value4);
                    else {
                        URI = xmlXPathNsLookup(ctxt->context, op->value5);
                        if (URI == NULL)
                            XP_ERROR0(XPATH_UNDEF_PREFIX_ERROR);
                        func = xmlXPathFunctionLookupNS(ctxt->context,
                                                        op->value4, URI);
                    }
                    if (func == NULL)
                        XP_ERROR0(XPATH_UNKNOWN_FUNC_ERROR);
                    op->cache = func;
                    op->cacheURI = (void *) URI;
                }
                oldFunc = ctxt->context->function;
                oldFuncURI = ctxt->context->functionURI;
                ctxt->context->function = op->value4;
                ctxt->context->functionURI = op->cacheURI;
                func(ctxt, op->value);
                ctxt->context->function = oldFunc;
                ctxt->context->functionURI = oldFuncURI;
                if ((ctxt->error == XPATH_EXPRESSION_OK) &&
                    (ctxt->valueNr != frame + 1))
                    XP_ERROR0(XPATH_STACK_ERROR);
                break;
            }
        case XPATH_OP_ARG:
            if (op->ch1 != -1) {
                total += xmlXPathCompOpEval(ctxt, &comp->steps[op->ch1]);
	        CHECK_ERROR0;
            }
            if (op->ch2 != -1) {
                total += xmlXPathCompOpEval(ctxt, &comp->steps[op->ch2]);
	        CHECK_ERROR0;
	    }
            break;
        case XPATH_OP_PREDICATE:
        case XPATH_OP_FILTER:{
                xmlXPathObjectPtr obj;
                xmlNodeSetPtr set;

                /*
                 * Optimization for ()[1] selection i.e. the first elem
                 */
                if ((op->ch1 != -1) && (op->ch2 != -1) &&
#ifdef XP_OPTIMIZED_FILTER_FIRST
		    /*
		    * FILTER TODO: Can we assume that the inner processing
		    *  will result in an ordered list if we have an
		    *  XPATH_OP_FILTER?
		    *  What about an additional field or flag on
		    *  xmlXPathObject like @sorted ? This way we wouldn't need
		    *  to assume anything, so it would be more robust and
		    *  easier to optimize.
		    */
                    ((comp->steps[op->ch1].op == XPATH_OP_SORT) || /* 18 */
		     (comp->steps[op->ch1].op == XPATH_OP_FILTER)) && /* 17 */
#else
		    (comp->steps[op->ch1].op == XPATH_OP_SORT) &&
#endif
                    (comp->steps[op->ch2].op == XPATH_OP_VALUE)) { /* 12 */
                    xmlXPathObjectPtr val;

                    val = comp->steps[op->ch2].value4;
                    if ((val != NULL) && (val->type == XPATH_NUMBER) &&
                        (val->floatval == 1.0)) {
                        xmlNodePtr first = NULL;

                        total +=
                            xmlXPathCompOpEvalFirst(ctxt,
                                                    &comp->steps[op->ch1],
                                                    &first);
			CHECK_ERROR0;
                        /*
                         * The nodeset should be in document order,
                         * Keep only the first value
                         */
                        if ((ctxt->value != NULL) &&
                            (ctxt->value->type == XPATH_NODESET) &&
                            (ctxt->value->nodesetval != NULL) &&
                            (ctxt->value->nodesetval->nodeNr > 1))
                            xmlXPathNodeSetClearFromPos(ctxt->value->nodesetval,
                                                        1, 1);
                        break;
                    }
                }
                /*
                 * Optimization for ()[last()] selection i.e. the last elem
                 */
                if ((op->ch1 != -1) && (op->ch2 != -1) &&
                    (comp->steps[op->ch1].op == XPATH_OP_SORT) &&
                    (comp->steps[op->ch2].op == XPATH_OP_SORT)) {
                    int f = comp->steps[op->ch2].ch1;

                    if ((f != -1) &&
                        (comp->steps[f].op == XPATH_OP_FUNCTION) &&
                        (comp->steps[f].value5 == NULL) &&
                        (comp->steps[f].value == 0) &&
                        (comp->steps[f].value4 != NULL) &&
                        (xmlStrEqual
                         (comp->steps[f].value4, BAD_CAST "last"))) {
                        xmlNodePtr last = NULL;

                        total +=
                            xmlXPathCompOpEvalLast(ctxt,
                                                   &comp->steps[op->ch1],
                                                   &last);
			CHECK_ERROR0;
                        /*
                         * The nodeset should be in document order,
                         * Keep only the last value
                         */
                        if ((ctxt->value != NULL) &&
                            (ctxt->value->type == XPATH_NODESET) &&
                            (ctxt->value->nodesetval != NULL) &&
                            (ctxt->value->nodesetval->nodeTab != NULL) &&
                            (ctxt->value->nodesetval->nodeNr > 1))
                            xmlXPathNodeSetKeepLast(ctxt->value->nodesetval);
                        break;
                    }
                }
		/*
		* Process inner predicates first.
		* Example "index[parent::book][1]":
		* ...
		*   PREDICATE   <-- we are here "[1]"
		*     PREDICATE <-- process "[parent::book]" first
		*       SORT
		*         COLLECT  'parent' 'name' 'node' book
		*           NODE
		*     ELEM Object is a number : 1
		*/
                if (op->ch1 != -1)
                    total +=
                        xmlXPathCompOpEval(ctxt, &comp->steps[op->ch1]);
		CHECK_ERROR0;
                if (op->ch2 == -1)
                    break;
                if (ctxt->value == NULL)
                    break;

                /*
                 * In case of errors, xmlXPathNodeSetFilter can pop additional
                 * nodes from the stack. We have to temporarily remove the
                 * nodeset object from the stack to avoid freeing it
                 * prematurely.
                 */
                CHECK_TYPE0(XPATH_NODESET);
                obj = xmlXPathValuePop(ctxt);
                set = obj->nodesetval;
                if (set != NULL)
                    xmlXPathNodeSetFilter(ctxt, set, op->ch2,
                                          1, set->nodeNr, 1);
                xmlXPathValuePush(ctxt, obj);
                break;
            }
        case XPATH_OP_SORT:
            if (op->ch1 != -1)
                total += xmlXPathCompOpEval(ctxt, &comp->steps[op->ch1]);
	    CHECK_ERROR0;
            if ((ctxt->value != NULL) &&
                (ctxt->value->type == XPATH_NODESET) &&
                (ctxt->value->nodesetval != NULL) &&
		(ctxt->value->nodesetval->nodeNr > 1))
	    {
                xmlXPathNodeSetSort(ctxt->value->nodesetval);
	    }
            break;
        default:
            XP_ERROR0(XPATH_INVALID_OPERAND);
            break;
    }

    ctxt->context->depth -= 1;
    return (total);
}